

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UChar UVar2;
  int *piVar3;
  undefined1 uVar4;
  int32_t iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  UBool useFallback;
  int iVar10;
  ulong uVar11;
  char cVar12;
  UChar *pUVar13;
  UChar32 c;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  char cVar17;
  UConverter *cnv;
  uint8_t *targetLimit;
  UChar *pUVar18;
  undefined1 local_b3;
  undefined2 uStack_b2;
  uint local_b0;
  undefined4 local_ac;
  uint local_a4;
  void *local_a0;
  uint32_t local_98;
  uint32_t value;
  int *local_90;
  uint8_t *local_88;
  UErrorCode *local_80;
  ulong local_78;
  UConverterFromUnicodeArgs *local_70;
  UChar *local_68;
  uint8_t *local_60;
  UChar *local_58;
  uint8_t *local_50;
  UConverter *local_48;
  undefined4 *local_40;
  ulong local_38;
  
  cnv = args->converter;
  local_88 = (uint8_t *)args->target;
  targetLimit = (uint8_t *)args->targetLimit;
  pUVar18 = args->source;
  pUVar13 = args->sourceLimit;
  local_90 = args->offsets;
  pvVar15 = cnv->extraInfo;
  local_40 = (undefined4 *)((long)pvVar15 + 0x62);
  uVar14 = (ulong)(uint)cnv->fromUChar32;
  local_60 = local_88;
  local_b0 = 0;
  local_98 = 0;
  local_70 = args;
  local_80 = err;
  local_48 = cnv;
  local_50 = targetLimit;
  local_a0 = pvVar15;
  local_58 = pUVar13;
  if (cnv->fromUChar32 != 0 && local_88 < targetLimit) goto LAB_002f5c89;
LAB_002f5c4d:
  do {
    if (pUVar13 <= pUVar18) {
LAB_002f6115:
      if ((((*err < U_ILLEGAL_ARGUMENT_ERROR) && (*(char *)((long)pvVar15 + 0x66) != '\0')) &&
          (args->flush != '\0')) && ((pUVar13 <= pUVar18 && (cnv->fromUChar32 == 0)))) {
        *(undefined1 *)((long)pvVar15 + 0x66) = 0;
        pUVar13 = args->source;
        iVar10 = (int)((ulong)((long)pUVar18 - (long)pUVar13) >> 1);
        if (iVar10 < 1) {
          uVar6 = 0xffffffff;
        }
        else {
          uVar6 = iVar10 - 1;
          if (((pUVar13[uVar6] & 0xfc00U) == 0xdc00) &&
             ((uVar6 == 0 || ((pUVar13[iVar10 - 2] & 0xfc00U) == 0xd800)))) {
            uVar6 = iVar10 - 2;
          }
        }
        fromUWriteUInt8(cnv,"\x0f",1,&local_88,(char *)targetLimit,&local_90,uVar6,err);
      }
      goto LAB_002f61da;
    }
    local_60 = local_88;
    if (targetLimit <= local_88) {
      *err = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002f61da;
    }
    UVar2 = *pUVar18;
    uVar14 = (ulong)(ushort)UVar2;
    pUVar18 = pUVar18 + 1;
    if ((UVar2 & 0xf800U) == 0xd800) {
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_002f5c89:
        local_88 = local_60;
        if (pUVar13 <= pUVar18) {
          cnv->fromUChar32 = (int)uVar14;
          goto LAB_002f6115;
        }
        UVar2 = *pUVar18;
        if (((ushort)UVar2 & 0xfc00) == 0xdc00) {
          pUVar18 = pUVar18 + 1;
          uVar14 = (ulong)((int)uVar14 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400);
          cnv->fromUChar32 = 0;
          goto LAB_002f5cbf;
        }
      }
LAB_002f60f3:
      *err = U_ILLEGAL_CHAR_FOUND;
      cnv->fromUChar32 = (UChar32)uVar14;
      goto LAB_002f61da;
    }
LAB_002f5cbf:
    uVar6 = (uint)uVar14;
    local_88 = local_60;
    if ((int)uVar6 < 0x80) {
      if (((int)uVar6 < 0x20) && ((0x800c000U >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_002f60f3;
      uVar4 = (undefined1)uVar14;
      if (*(char *)((long)pvVar15 + 0x66) == '\0') {
        iVar10 = 1;
      }
      else {
        local_ac = (uint)CONCAT21(local_ac._2_2_,uVar4) << 8;
        *(undefined1 *)((long)pvVar15 + 0x66) = 0;
        iVar10 = 2;
        local_b0 = 0;
        uVar4 = 0xf;
      }
      local_ac = CONCAT31(local_ac._1_3_,uVar4);
      if ((uVar6 == 0xd) || (uVar6 == 10)) {
        *(undefined2 *)(local_40 + 1) = 0;
        *local_40 = 0;
        local_b0 = 0;
      }
    }
    else {
      if (local_b0 == 0) {
        bVar1 = *(byte *)((long)pvVar15 + 99);
        cVar12 = bVar1 + (bVar1 == 0);
        if (*(int *)((long)pvVar15 + 0x6c) == 1) {
          if (cVar12 == '\x02') {
            _local_b3 = 0x210102;
          }
          else if (cVar12 == '\x01') {
            _local_b3 = 0x22101;
          }
          else {
            _local_b3 = CONCAT21(0x201,cVar12);
          }
          local_b0 = 3;
        }
        else if (*(int *)((long)pvVar15 + 0x6c) == 0) {
          if (bVar1 < 2) {
            _local_b3 = CONCAT11(0x21,cVar12);
          }
          else {
            _local_b3 = CONCAT11(1,cVar12);
          }
          local_b0 = 2;
        }
        else {
          _local_b3 = CONCAT12(uStack_b2._1_1_,0x121);
          local_b0 = 0;
        }
      }
      local_68 = pUVar18;
      useFallback = cnv->useFallback;
      local_38 = (ulong)local_b0;
      uVar11 = 0;
      iVar10 = 0;
      local_a4 = 0;
      lVar16 = 0;
      local_78 = uVar14;
      while( true ) {
        cnv = local_48;
        targetLimit = local_50;
        pUVar13 = local_58;
        pUVar18 = local_68;
        args = local_70;
        cVar12 = (char)lVar16;
        c = (UChar32)uVar14;
        if ((local_38 <= uVar11) || (0 < iVar10)) break;
        bVar1 = (&local_b3)[uVar11];
        if (0 < (long)(char)bVar1) {
          if (bVar1 < 0x20) {
            iVar5 = MBCS_FROM_UCHAR32_ISO2022
                              (*(UConverterSharedData **)((long)local_a0 + (long)(char)bVar1 * 8),c,
                               &value,useFallback,1);
            if ((iVar5 == 2) ||
               ((uVar14 = local_78, pvVar15 = local_a0, iVar5 == -2 && (iVar10 == 0)))) {
              lVar16 = 1;
              local_98 = value;
              useFallback = '\0';
              local_a4 = (uint)(char)bVar1;
              iVar10 = iVar5;
              goto LAB_002f5e31;
            }
          }
          else {
            iVar5 = MBCS_FROM_UCHAR32_ISO2022
                              (*(UConverterSharedData **)((long)pvVar15 + 0x18),c,&value,useFallback
                               ,2);
            uVar14 = local_78;
            pvVar15 = local_a0;
            if ((iVar5 == 3) || ((iVar5 == -3 && (iVar10 == 0)))) {
              if (-1 >= iVar5) {
                useFallback = '\0';
              }
              local_98 = value;
              iVar10 = (uint)(-1 < iVar5) * 4 + -2;
              cVar12 = (char)(value >> 0x10);
              if (cVar12 == -0x7f) {
                lVar16 = 1;
                local_a4 = (uint)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),0x21);
              }
              else {
                if ((value >> 0x10 & 0xff) != 0x82) {
                  local_a4 = (uint)CONCAT11((char)(value >> 0x18),cVar12 + -0x60);
                  if (*(int *)((long)local_a0 + 0x6c) == 1) {
                    lVar16 = 3;
                  }
                  else {
                    iVar10 = 0;
                  }
                  goto LAB_002f5e35;
                }
                lVar16 = 2;
                local_a4 = 0x22;
              }
LAB_002f5e31:
              uVar14 = local_78;
              pvVar15 = local_a0;
              local_98 = value;
            }
          }
        }
LAB_002f5e35:
        uVar11 = uVar11 + 1;
      }
      if (iVar10 == 0) {
        *local_80 = U_INVALID_CHAR_FOUND;
        local_48->fromUChar32 = c;
        goto LAB_002f61da;
      }
      uVar11 = 0;
      cVar17 = (char)local_a4;
      if (cVar17 != *(char *)((long)local_40 + lVar16)) {
        lVar9 = (long)cVar17 + -0x1e;
        if (cVar17 < '\x03') {
          lVar9 = (long)cVar17;
        }
        local_ac = *(int *)(_ZL13escSeqCharsCN_rel + *(int *)(_ZL13escSeqCharsCN_rel + lVar9 * 4));
        *(char *)((long)local_40 + lVar16) = cVar17;
        if (cVar12 == '\x01') {
          local_b0 = 0;
        }
        uVar11 = 4;
      }
      if (cVar12 != *(char *)((long)pvVar15 + 0x66)) {
        uVar7 = uVar11 | 1;
        if (cVar12 == '\x02') {
          *(undefined1 *)((long)&local_ac + uVar11) = 0x1b;
          uVar11 = (ulong)((uint)uVar11 | 2);
          *(undefined1 *)((long)&local_ac + uVar7) = 0x4e;
          args = local_70;
          pUVar18 = local_68;
        }
        else if ((int)lVar16 == 1) {
          *(undefined1 *)((long)&local_ac + uVar11) = 0xe;
          *(undefined1 *)((long)pvVar15 + 0x66) = 1;
          uVar11 = uVar7;
        }
        else {
          *(undefined1 *)((long)&local_ac + uVar11) = 0x1b;
          uVar11 = (ulong)((uint)uVar11 | 2);
          *(undefined1 *)((long)&local_ac + uVar7) = 0x4f;
        }
      }
      err = local_80;
      iVar10 = (int)uVar11 + 2;
      *(ushort *)((long)&local_ac + uVar11) = (ushort)local_98 << 8 | (ushort)local_98 >> 8;
    }
    piVar3 = local_90;
    if (iVar10 == 2) {
      if (local_60 + 2 <= targetLimit) {
        *local_60 = (uint8_t)local_ac;
        local_88 = local_60 + 2;
        local_60[1] = local_ac._1_1_;
        if (local_90 != (int *)0x0) {
          iVar10 = -1;
          if (0xffff < (uint)uVar14) {
            iVar10 = -2;
          }
          iVar10 = (int)((ulong)((long)pUVar18 - (long)args->source) >> 1) + iVar10;
          *local_90 = iVar10;
          local_90 = local_90 + 2;
          piVar3[1] = iVar10;
        }
        goto LAB_002f5c4d;
      }
    }
    else if (iVar10 == 1) {
      local_88 = local_60 + 1;
      *local_60 = (uint8_t)local_ac;
      if (local_90 != (int *)0x0) {
        local_90 = local_90 + 1;
        *piVar3 = (int)((ulong)((long)pUVar18 - (long)args->source) >> 1) + -1;
      }
      goto LAB_002f5c4d;
    }
    iVar8 = -1;
    if (0xffff < (uint)uVar14) {
      iVar8 = -2;
    }
    fromUWriteUInt8(cnv,(char *)&local_ac,iVar10,&local_88,(char *)targetLimit,&local_90,
                    (int)((ulong)((long)pUVar18 - (long)args->source) >> 1) + iVar8,err);
    pvVar15 = local_a0;
    if (U_ZERO_ERROR < *err) {
LAB_002f61da:
      args->source = pUVar18;
      args->target = (char *)local_88;
      return;
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err){
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len;
    int8_t choices[3];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while( source < sourceLimit){
        if(target < targetLimit){

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
             if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do the conversion */
            if(sourceChar <= 0x007f ){
                /* do not convert SO/SI/ESC */
                if(IS_2022_CONTROL(sourceChar)) {
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }

                /* US-ASCII */
                if(pFromU2022State->g == 0) {
                    buffer[0] = (char)sourceChar;
                    len = 1;
                } else {
                    buffer[0] = UCNV_SI;
                    buffer[1] = (char)sourceChar;
                    len = 2;
                    pFromU2022State->g = 0;
                    choiceCount = 0;
                }
                if(sourceChar == CR || sourceChar == LF) {
                    /* reset the state at the end of a line */
                    uprv_memset(pFromU2022State, 0, sizeof(ISO2022State));
                    choiceCount = 0;
                }
            }
            else{
                /* convert U+0080..U+10ffff */
                int32_t i;
                int8_t cs, g;

                if(choiceCount == 0) {
                    /* try the current SO/G1 converter first */
                    choices[0] = pFromU2022State->cs[1];

                    /* default to GB2312_1 if none is designated yet */
                    if(choices[0] == 0) {
                        choices[0] = GB2312_1;
                    }

                    if(converterData->version == 0) {
                        /* ISO-2022-CN */

                        /* try the other SO/G1 converter; a CNS_11643_1 lookup may result in any plane */
                        if(choices[0] == GB2312_1) {
                            choices[1] = (int8_t)CNS_11643_1;
                        } else {
                            choices[1] = (int8_t)GB2312_1;
                        }

                        choiceCount = 2;
                    } else if (converterData->version == 1) {
                        /* ISO-2022-CN-EXT */

                        /* try one of the other converters */
                        switch(choices[0]) {
                        case GB2312_1:
                            choices[1] = (int8_t)CNS_11643_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        case ISO_IR_165:
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)CNS_11643_1;
                            break;
                        default: /* CNS_11643_x */
                            choices[1] = (int8_t)GB2312_1;
                            choices[2] = (int8_t)ISO_IR_165;
                            break;
                        }

                        choiceCount = 3;
                    } else {
                        choices[0] = (int8_t)CNS_11643_1;
                        choices[1] = (int8_t)GB2312_1;
                    }
                }

                cs = g = 0;
                /*
                 * len==0: no mapping found yet
                 * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
                 * len>0: found a roundtrip result, done
                 */
                len = 0;
                /*
                 * We will turn off useFallback after finding a fallback,
                 * but we still get fallbacks from PUA code points as usual.
                 * Therefore, we will also need to check that we don't overwrite
                 * an early fallback with a later one.
                 */
                useFallback = cnv->useFallback;

                for(i = 0; i < choiceCount && len <= 0; ++i) {
                    int8_t cs0 = choices[i];
                    if(cs0 > 0) {
                        uint32_t value;
                        int32_t len2;
                        if(cs0 >= CNS_11643_0) {
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[CNS_11643],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_3);
                            if(len2 == 3 || (len2 == -3 && len == 0)) {
                                targetValue = value;
                                cs = (int8_t)(CNS_11643_0 + (value >> 16) - 0x80);
                                if(len2 >= 0) {
                                    len = 2;
                                } else {
                                    len = -2;
                                    useFallback = FALSE;
                                }
                                if(cs == CNS_11643_1) {
                                    g = 1;
                                } else if(cs == CNS_11643_2) {
                                    g = 2;
                                } else /* plane 3..7 */ if(converterData->version == 1) {
                                    g = 3;
                                } else {
                                    /* ISO-2022-CN (without -EXT) does not support plane 3..7 */
                                    len = 0;
                                }
                            }
                        } else {
                            /* GB2312_1 or ISO-IR-165 */
                            U_ASSERT(cs0<UCNV_2022_MAX_CONVERTERS);
                            len2 = MBCS_FROM_UCHAR32_ISO2022(
                                        converterData->myConverterArray[cs0],
                                        sourceChar,
                                        &value,
                                        useFallback,
                                        MBCS_OUTPUT_2);
                            if(len2 == 2 || (len2 == -2 && len == 0)) {
                                targetValue = value;
                                len = len2;
                                cs = cs0;
                                g = 1;
                                useFallback = FALSE;
                            }
                        }
                    }
                }

                if(len != 0) {
                    len = 0; /* count output bytes; it must have been abs(len) == 2 */

                    /* write the designation sequence if necessary */
                    if(cs != pFromU2022State->cs[g]) {
                        if(cs < CNS_11643) {
                            uprv_memcpy(buffer, escSeqCharsCN[cs], 4);
                        } else {
                            U_ASSERT(cs >= CNS_11643_1);
                            uprv_memcpy(buffer, escSeqCharsCN[CNS_11643 + (cs - CNS_11643_1)], 4);
                        }
                        len = 4;
                        pFromU2022State->cs[g] = cs;
                        if(g == 1) {
                            /* changing the SO/G1 charset invalidates the choices[] */
                            choiceCount = 0;
                        }
                    }

                    /* write the shift sequence if necessary */
                    if(g != pFromU2022State->g) {
                        switch(g) {
                        case 1:
                            buffer[len++] = UCNV_SO;

                            /* set the new state only if it is the locking shift SO/G1, not for SS2 or SS3 */
                            pFromU2022State->g = 1;
                            break;
                        case 2:
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4e;
                            break;
                        default: /* case 3 */
                            buffer[len++] = 0x1b;
                            buffer[len++] = 0x4f;
                            break;
                        }
                    }

                    /* write the two output bytes */
                    buffer[len++] = (char)(targetValue >> 8);
                    buffer[len++] = (char)targetValue;
                } else {
                    /* if we cannot find the character after checking all codepages
                     * then this is an error
                     */
                    *err = U_INVALID_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* output len>0 bytes in buffer[] */
            if(len == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(len == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, len,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-CN conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        pFromU2022State->g!=0 &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        /* we are switching to ASCII */
        pFromU2022State->g=0;

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            SHIFT_IN_STR, 1,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}